

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_xi2.cpp
# Opt level: O2

bool __thiscall
QXcbConnection::startSystemMoveResizeForTouch(QXcbConnection *this,xcb_window_t window,int edges)

{
  byte bVar1;
  long lVar2;
  Span *pSVar3;
  Entry *pEVar4;
  int iVar5;
  Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *pDVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  TouchDeviceData *pTVar12;
  long in_FS_OFFSET;
  byte bVar13;
  QDebug local_d0;
  piter local_c8;
  piter local_b0;
  TouchDeviceData deviceData;
  
  bVar13 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = (piter)QHash<int,_QXcbConnection::TouchDeviceData>::constBegin
                              ((QHash<int,_QXcbConnection::TouchDeviceData> *)(this + 0x300));
  do {
    uVar10 = local_b0.bucket;
    pDVar6 = local_b0.d;
    if (pDVar6 == (Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *)0x0 &&
        uVar10 == 0) {
LAB_0014b5b7:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return pDVar6 != (Data<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_> *)0x0 ||
               uVar10 != 0;
      }
      __stack_chk_fail();
    }
    puVar11 = &DAT_001885a8;
    pTVar12 = &deviceData;
    for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
      pTVar12->qtTouchDevice = (QPointingDevice *)*puVar11;
      puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      pTVar12 = (TouchDeviceData *)((long)pTVar12 + (ulong)bVar13 * -0x10 + 8);
    }
    TouchDeviceData::TouchDeviceData
              (&deviceData,
               (TouchDeviceData *)
               (pDVar6->spans[uVar10 >> 7].entries
                [pDVar6->spans[uVar10 >> 7].offsets[(uint)local_b0.bucket & 0x7f]].storage.data + 8)
              );
    iVar5 = QInputDevice::type();
    if (iVar5 == 2) {
      local_c8.bucket = 0xaaaaaaaaaaaaaaaa;
      local_c8.d = (Data<QHashPrivate::Node<int,_QWindowSystemInterface::TouchPoint>_> *)
                   0xaaaaaaaaaaaaaaaa;
      local_c8 = (piter)QHash<int,_QWindowSystemInterface::TouchPoint>::constBegin
                                  (&deviceData.touchPoints);
      while( true ) {
        if (local_c8.d == (Data<QHashPrivate::Node<int,_QWindowSystemInterface::TouchPoint>_> *)0x0
            && local_c8.bucket == 0) break;
        pSVar3 = (local_c8.d)->spans;
        uVar7 = local_c8.bucket >> 7;
        uVar9 = (uint)local_c8.bucket & 0x7f;
        pEVar4 = pSVar3[uVar7].entries;
        bVar1 = pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data[0x58];
        if ((bVar1 < 5) && ((0x16U >> (bVar1 & 0x1f) & 1) != 0)) {
          *(xcb_window_t *)(this + 0x308) = window;
          *(undefined2 *)(this + 0x30c) =
               *(undefined2 *)
                (local_b0.d)->spans[local_b0.bucket >> 7].entries
                [(local_b0.d)->spans[local_b0.bucket >> 7].offsets[(uint)local_b0.bucket & 0x7f]].
                storage.data;
          *(undefined4 *)(this + 0x310) =
               *(undefined4 *)pEVar4[pSVar3[uVar7].offsets[uVar9]].storage.data;
          *(int *)(this + 0x314) = edges;
          this[0x318] = (QXcbConnection)0x1;
          lVar8 = QtPrivateLogging::lcQpaInputDevices();
          if ((*(byte *)(lVar8 + 0x10) & 1) != 0) {
            QMessageLogger::debug();
            QDebug::operator<<(&local_d0,"triggered system move or resize from touch");
            QDebug::~QDebug(&local_d0);
          }
          if ((bVar1 < 5) && ((0x16U >> (bVar1 & 0x1f) & 1) != 0)) {
            TouchDeviceData::~TouchDeviceData(&deviceData);
            goto LAB_0014b5b7;
          }
        }
        QHashPrivate::iterator<QHashPrivate::Node<int,_QWindowSystemInterface::TouchPoint>_>::
        operator++(&local_c8);
      }
    }
    TouchDeviceData::~TouchDeviceData(&deviceData);
    QHashPrivate::iterator<QHashPrivate::Node<int,_QXcbConnection::TouchDeviceData>_>::operator++
              (&local_b0);
  } while( true );
}

Assistant:

bool QXcbConnection::startSystemMoveResizeForTouch(xcb_window_t window, int edges)
{
    QHash<int, TouchDeviceData>::const_iterator devIt = m_touchDevices.constBegin();
    for (; devIt != m_touchDevices.constEnd(); ++devIt) {
        TouchDeviceData deviceData = devIt.value();
        if (deviceData.qtTouchDevice->type() == QInputDevice::DeviceType::TouchScreen) {
            auto pointIt = deviceData.touchPoints.constBegin();
            for (; pointIt != deviceData.touchPoints.constEnd(); ++pointIt) {
                QEventPoint::State state = pointIt.value().state;
                if (state == QEventPoint::State::Updated || state == QEventPoint::State::Pressed || state == QEventPoint::State::Stationary) {
                    m_startSystemMoveResizeInfo.window = window;
                    m_startSystemMoveResizeInfo.deviceid = devIt.key();
                    m_startSystemMoveResizeInfo.pointid = pointIt.key();
                    m_startSystemMoveResizeInfo.edges = edges;
                    setDuringSystemMoveResize(true);
                    qCDebug(lcQpaInputDevices) << "triggered system move or resize from touch";
                    return true;
                }
            }
        }
    }
    return false;
}